

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::BuildResult(Clipper *this,Paths *polys)

{
  cInt cVar1;
  int iVar2;
  long lVar3;
  _func_int **pp_Var4;
  long lVar5;
  int iVar6;
  size_type __n;
  ulong uVar7;
  Path pg;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_48;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(polys,*(long *)(this->_vptr_Clipper[-3] +
                           (long)&(this->m_Maxima).
                                  super__List_base<long_long,_std::allocator<long_long>_>) -
                  *(long *)((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]) >> 3);
  pp_Var4 = this->_vptr_Clipper;
  lVar5 = *(long *)((long)&this->m_ClipType + (long)pp_Var4[-3]);
  if (*(long *)(pp_Var4[-3] +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) !=
      lVar5) {
    uVar7 = 0;
    do {
      if (*(long *)(*(long *)(lVar5 + uVar7 * 8) + 0x18) != 0) {
        local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
        local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
        lVar5 = *(long *)(*(long *)(*(long *)(*(long *)((long)&this->m_ClipType + (long)pp_Var4[-3])
                                             + uVar7 * 8) + 0x18) + 0x20);
        if (lVar5 != 0) {
          __n = 0;
          lVar3 = lVar5;
          iVar2 = 1;
          do {
            iVar6 = iVar2;
            lVar3 = *(long *)(lVar3 + 0x18);
            __n = __n + 1;
            iVar2 = iVar6 + 1;
          } while (lVar3 != lVar5);
          if ((int)__n != 1) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                      (&local_48,__n);
            do {
              if (local_48.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_48.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
                _M_realloc_insert<ClipperLib::IntPoint_const&>
                          ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                           &local_48,
                           (iterator)
                           local_48.
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(IntPoint *)(lVar5 + 8));
              }
              else {
                cVar1 = *(cInt *)(lVar5 + 0x10);
                (local_48.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->X = ((IntPoint *)(lVar5 + 8))->X;
                (local_48.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->Y = cVar1;
                local_48.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     local_48.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              lVar5 = *(long *)(lVar5 + 0x20);
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(polys,&local_48);
            if (local_48.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.
                                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.
                                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        pp_Var4 = this->_vptr_Clipper;
      }
      uVar7 = uVar7 + 1;
      lVar5 = *(long *)((long)&this->m_ClipType + (long)pp_Var4[-3]);
    } while (uVar7 < (ulong)(*(long *)(pp_Var4[-3] +
                                      (long)&(this->m_Maxima).
                                             super__List_base<long_long,_std::allocator<long_long>_>
                                      ) - lVar5 >> 3));
  }
  return;
}

Assistant:

void Clipper::BuildResult(Paths &polys)
{
  polys.reserve(m_PolyOuts.size());
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    if (!m_PolyOuts[i]->Pts) continue;
    Path pg;
    OutPt* p = m_PolyOuts[i]->Pts->Prev;
    int cnt = PointCount(p);
    if (cnt < 2) continue;
    pg.reserve(cnt);
    for (int i = 0; i < cnt; ++i)
    {
      pg.push_back(p->Pt);
      p = p->Prev;
    }
    polys.push_back(pg);
  }
}